

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe_crypto.cpp
# Opt level: O0

void libtorrent::rc4_init(uchar *in,size_t len,rc4 *state)

{
  value_type_conflict3 vVar1;
  byte bVar2;
  int iVar3;
  value_type_conflict3 *pvVar4;
  pointer __src;
  pointer __dest;
  byte *pbVar5;
  int iVar6;
  int local_148;
  uint local_144;
  int j;
  int y;
  int x;
  int keylen;
  uint8_t *s;
  undefined1 local_128 [7];
  uint8_t tmp;
  array<std::uint8_t,_key_size> key;
  size_t key_size;
  rc4 *state_local;
  size_t len_local;
  uchar *in_local;
  
  key.super_array<unsigned_char,_256UL>._M_elems[0xf8] = '\0';
  key.super_array<unsigned_char,_256UL>._M_elems[0xf9] = '\x01';
  key.super_array<unsigned_char,_256UL>._M_elems[0xfa] = '\0';
  key.super_array<unsigned_char,_256UL>._M_elems[0xfb] = '\0';
  key.super_array<unsigned_char,_256UL>._M_elems[0xfc] = '\0';
  key.super_array<unsigned_char,_256UL>._M_elems[0xfd] = '\0';
  key.super_array<unsigned_char,_256UL>._M_elems[0xfe] = '\0';
  key.super_array<unsigned_char,_256UL>._M_elems[0xff] = '\0';
  state_local = (rc4 *)len;
  if (0x100 < len) {
    state_local = (rc4 *)0x100;
  }
  state->x = 0;
  len_local = (size_t)in;
  while (state_local != (rc4 *)0x0) {
    vVar1 = *(value_type_conflict3 *)len_local;
    iVar3 = state->x;
    state->x = iVar3 + 1;
    pvVar4 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_256UL>_>::
             operator[](&state->buf,(long)iVar3);
    *pvVar4 = vVar1;
    state_local = (rc4 *)(state_local[-1].buf.super_array<unsigned_char,_256UL>._M_elems + 0xff);
    len_local = len_local + 1;
  }
  __src = std::array<unsigned_char,_256UL>::data(&(state->buf).super_array<unsigned_char,_256UL>);
  __dest = std::array<unsigned_char,_256UL>::data((array<unsigned_char,_256UL> *)local_128);
  memcpy(__dest,__src,0x100);
  iVar3 = state->x;
  for (j = 0; j < 0x100; j = j + 1) {
    __src[j] = (value_type_conflict3)j;
  }
  local_144 = 0;
  local_148 = 0;
  for (j = 0; j < 0x100; j = j + 1) {
    pbVar5 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_256UL>_>::
             operator[](&state->buf,(long)j);
    bVar2 = *pbVar5;
    iVar6 = local_148 + 1;
    pbVar5 = aux::container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_256UL>_>::
             operator[]((container_wrapper<unsigned_char,_long,_std::array<unsigned_char,_256UL>_> *
                        )local_128,(long)local_148);
    local_144 = local_144 + bVar2 + (uint)*pbVar5 & 0xff;
    local_148 = iVar6;
    if (iVar6 == iVar3) {
      local_148 = 0;
    }
    vVar1 = __src[j];
    __src[j] = __src[(int)local_144];
    __src[(int)local_144] = vVar1;
  }
  state->x = 0;
  state->y = 0;
  return;
}

Assistant:

void rc4_init(const unsigned char* in, std::size_t len, rc4 *state)
{
	std::size_t const key_size = sizeof(state->buf);
	aux::array<std::uint8_t, key_size> key;
	std::uint8_t tmp, *s;
	int keylen, x, y, j;

	TORRENT_ASSERT(state != nullptr);
	TORRENT_ASSERT(len <= key_size);
	if (len > key_size) len = key_size;

	state->x = 0;
	while (len--) {
		state->buf[state->x++] = *in++;
	}

	/* extract the key */
	s = state->buf.data();
	std::memcpy(key.data(), s, key_size);
	keylen = state->x;

	/* make RC4 perm and shuffle */
	for (x = 0; x < int(key_size); ++x) {
		s[x] = x & 0xff;
	}

	for (j = x = y = 0; x < int(key_size); x++) {
		y = (y + state->buf[x] + key[j++]) & 255;
		if (j == keylen) {
			j = 0;
		}
		tmp = s[x]; s[x] = s[y]; s[y] = tmp;
	}
	state->x = 0;
	state->y = 0;
}